

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  ArenaStringPtr *pAVar1;
  string *psVar2;
  Descriptor *message_00;
  string *psVar3;
  string local_40;
  string *local_20;
  string *type_url_prefix_local;
  Message *message_local;
  AnyMetadata *this_local;
  
  pAVar1 = this->type_url_;
  local_20 = type_url_prefix;
  type_url_prefix_local = (string *)message;
  message_local = (Message *)this;
  psVar2 = GetEmptyString_abi_cxx11_();
  message_00 = Message::GetDescriptor((Message *)type_url_prefix_local);
  anon_unknown_3::GetTypeUrl(&local_40,message_00,local_20);
  ArenaStringPtr::SetNoArena(pAVar1,psVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  psVar2 = type_url_prefix_local;
  pAVar1 = this->value_;
  psVar3 = GetEmptyStringAlreadyInited_abi_cxx11_();
  psVar3 = ArenaStringPtr::MutableNoArena(pAVar1,psVar3);
  MessageLite::SerializeToString((MessageLite *)psVar2,psVar3);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const string& type_url_prefix) {
  type_url_->SetNoArena(&::google::protobuf::internal::GetEmptyString(),
                        GetTypeUrl(message.GetDescriptor(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::google::protobuf::internal::GetEmptyStringAlreadyInited()));
}